

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_create_oss_vpc(void)

{
  code *pcVar1;
  char *__s;
  OssAdminCreateOssVpcRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_249;
  int ret;
  HttpTestListener *local_228;
  HttpTestListener *listener;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [55];
  allocator<char> local_191;
  string local_190 [32];
  OssAdminCreateOssVpcRequestType *local_170;
  OssAdmin *ossadmin;
  OssAdminCreateOssVpcResponseType resp;
  OssAdminCreateOssVpcRequestType req;
  
  aliyun::OssAdminCreateOssVpcRequestType::OssAdminCreateOssVpcRequestType
            ((OssAdminCreateOssVpcRequestType *)((long)&resp.vpc_id.field_2 + 8));
  aliyun::OssAdminCreateOssVpcResponseType::OssAdminCreateOssVpcResponseType
            ((OssAdminCreateOssVpcResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"cn-hangzhou",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"my_appid",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"my_secret",&local_1f1);
  pOVar2 = (OssAdminCreateOssVpcRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_190,local_1c8,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  local_170 = pOVar2;
  if (pOVar2 == (OssAdminCreateOssVpcRequestType *)0x0) {
    aliyun::OssAdminCreateOssVpcResponseType::~OssAdminCreateOssVpcResponseType
              ((OssAdminCreateOssVpcResponseType *)&ossadmin);
    aliyun::OssAdminCreateOssVpcRequestType::~OssAdminCreateOssVpcRequestType
              ((OssAdminCreateOssVpcRequestType *)((long)&resp.vpc_id.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_170,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_create_oss_vpc_response;
  local_228 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_249);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_249);
  HttpTestListener::Start(local_228);
  std::__cxx11::string::operator=((string *)(resp.vpc_id.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=((string *)(req.owner_account.field_2._M_local_buf + 8),"Region");
  std::__cxx11::string::operator=((string *)(req.region.field_2._M_local_buf + 8),"VirtualSwitchId")
  ;
  std::__cxx11::string::operator=
            ((string *)(req.virtual_switch_id.field_2._M_local_buf + 8),"VpcId");
  std::__cxx11::string::operator=((string *)(req.vpc_id.field_2._M_local_buf + 8),"Label");
  aliyun::OssAdmin::CreateOssVpc
            (local_170,(OssAdminCreateOssVpcResponseType *)((long)&resp.vpc_id.field_2 + 8),
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_228);
  pHVar3 = local_228;
  if (local_228 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_228);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_170;
  if (local_170 != (OssAdminCreateOssVpcRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_170);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_create_oss_vpc() {
  OssAdminCreateOssVpcRequestType req;
  OssAdminCreateOssVpcResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_create_oss_vpc_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.region = "Region";
  req.virtual_switch_id = "VirtualSwitchId";
  req.vpc_id = "VpcId";
  req.label = "Label";
  int ret = ossadmin->CreateOssVpc(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}